

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::SMDImporter::ParseSignedInt(SMDImporter *this,char *szCurrent,char **szCurrentOut,int *out)

{
  bool bVar1;
  int iVar2;
  int *out_local;
  char **szCurrentOut_local;
  char *szCurrent_local;
  SMDImporter *this_local;
  
  szCurrentOut_local = (char **)szCurrent;
  szCurrent_local = (char *)this;
  bVar1 = SkipSpaces<char>((char **)&szCurrentOut_local);
  if (bVar1) {
    iVar2 = strtol10((char *)szCurrentOut_local,szCurrentOut);
    *out = iVar2;
  }
  return bVar1;
}

Assistant:

bool SMDImporter::ParseSignedInt(const char* szCurrent, const char** szCurrentOut, int& out) {
    if(!SkipSpaces(&szCurrent)) {
        return false;
    }

    out = strtol10(szCurrent,szCurrentOut);
    return true;
}